

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  long lVar7;
  ulong uVar8;
  SystemInformation info;
  string result_list;
  string variable;
  string value;
  string key;
  SystemInformation SStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x21) ||
     (iVar5 = std::__cxx11::string::compare((char *)pbVar6), iVar5 != 0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"missing RESULT specification.","");
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar2 = pbVar6[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + pbVar6[1]._M_string_length);
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x80) ||
       (iVar5 = std::__cxx11::string::compare((char *)(pbVar6 + 2)), iVar5 != 0)) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"missing QUERY specification","");
      cmCommand::SetError(&this->super_cmCommand,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      bVar4 = false;
    }
    else {
      cmsys::SystemInformation::SystemInformation(&SStack_b8);
      cmsys::SystemInformation::RunCPUCheck(&SStack_b8);
      cmsys::SystemInformation::RunOSCheck(&SStack_b8);
      cmsys::SystemInformation::RunMemoryCheck(&SStack_b8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x7f < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
        uVar8 = 3;
        lVar7 = 0x68;
        paVar1 = &local_70.field_2;
        do {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          lVar3 = *(long *)((long)pbVar6 + lVar7 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,lVar3,
                     *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar7) + lVar3);
          if (uVar8 != 3) {
            std::__cxx11::string::append((char *)&local_b0);
          }
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_70._M_dataplus._M_p = (pointer)paVar1;
          bVar4 = GetValue(this,&SStack_b8,&local_50,&local_70);
          if (!bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p,
                              CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                       local_70.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            bVar4 = false;
            goto LAB_0037dd14;
          }
          std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar8 = uVar8 + 1;
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x20;
        } while (uVar8 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >>
                                5));
      }
      bVar4 = true;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_90,local_b0._M_dataplus._M_p);
LAB_0037dd14:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemInformation::~SystemInformation(&SStack_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::InitialPass(std::vector<std::string> const &args, cmExecutionStatus &)
{
  size_t current_index = 0;

  if(args.size() < (current_index + 2) || args[current_index] != "RESULT")
    {
    this->SetError("missing RESULT specification.");
    return false;
    }

  std::string variable = args[current_index + 1];
  current_index += 2;

  if(args.size() < (current_index + 2) || args[current_index] != "QUERY")
    {
    this->SetError("missing QUERY specification");
    return false;
    }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for(size_t i = current_index + 1; i < args.size(); ++i)
    {
    std::string key = args[i];
    if(i != current_index + 1)
      {
      result_list += ";";
      }
    std::string value;
    if(!this->GetValue(info, key, value)) return false;

    result_list += value;
    }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}